

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O1

PaError AlsaOpen(PaUtilHostApiRepresentation *hostApi,PaStreamParameters *params,
                StreamDirection streamDir,snd_pcm_t **pcm)

{
  undefined8 uVar1;
  int __pa_unsure_error_id;
  int iVar2;
  int iVar3;
  PaDeviceInfo *pPVar4;
  pthread_t __thread1;
  char *errorText;
  PaError PVar5;
  int iVar6;
  char *format;
  
  iVar3 = busyRetries_;
  if (params->hostApiSpecificStreamInfo == (void *)0x0) {
    pPVar4 = hostApi->deviceInfos[params->device] + 1;
  }
  else {
    pPVar4 = (PaDeviceInfo *)((long)params->hostApiSpecificStreamInfo + 0x18);
  }
  uVar1 = *(undefined8 *)pPVar4;
  iVar2 = snd_pcm_open(pcm,uVar1,streamDir == StreamDirection_In,1);
  if ((0 < iVar3) && (iVar2 == -0x10)) {
    iVar6 = 1;
    do {
      Pa_Sleep(10);
      iVar2 = snd_pcm_open(pcm,uVar1,streamDir == StreamDirection_In,1);
      if (iVar3 <= iVar6) break;
      iVar6 = iVar6 + 1;
    } while (iVar2 == -0x10);
  }
  if (iVar2 < 0) {
    *pcm = (snd_pcm_t *)0x0;
    PVar5 = (uint)(iVar2 == -0x10) * 8 + -0x2709;
    format = 
    "Expression \'ret\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1735\n"
    ;
  }
  else {
    iVar3 = snd_pcm_nonblock(*pcm,0);
    if (-1 < iVar3) {
      return 0;
    }
    __thread1 = pthread_self();
    iVar2 = pthread_equal(__thread1,paUnixMainThread);
    PVar5 = -9999;
    format = 
    "Expression \'alsa_snd_pcm_nonblock( *pcm, 0 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1737\n"
    ;
    if (iVar2 != 0) {
      errorText = (char *)snd_strerror(iVar3);
      PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar3,errorText);
    }
  }
  PaUtil_DebugPrint(format);
  return PVar5;
}

Assistant:

static PaError AlsaOpen( const PaUtilHostApiRepresentation *hostApi, const PaStreamParameters *params, StreamDirection
        streamDir, snd_pcm_t **pcm )
{
    PaError result = paNoError;
    int ret;
    const char* deviceName = "";
    const PaAlsaDeviceInfo *deviceInfo = NULL;
    PaAlsaStreamInfo *streamInfo = (PaAlsaStreamInfo *)params->hostApiSpecificStreamInfo;

    if( !streamInfo )
    {
        deviceInfo = GetDeviceInfo( hostApi, params->device );
        deviceName = deviceInfo->alsaName;
    }
    else
        deviceName = streamInfo->deviceString;

    PA_DEBUG(( "%s: Opening device %s\n", __FUNCTION__, deviceName ));
    if( (ret = OpenPcm( pcm, deviceName, streamDir == StreamDirection_In ? SND_PCM_STREAM_CAPTURE : SND_PCM_STREAM_PLAYBACK,
                    SND_PCM_NONBLOCK, 1 )) < 0 )
    {
        /* Not to be closed */
        *pcm = NULL;
        ENSURE_( ret, -EBUSY == ret ? paDeviceUnavailable : paBadIODeviceCombination );
    }
    ENSURE_( alsa_snd_pcm_nonblock( *pcm, 0 ), paUnanticipatedHostError );

end:
    return result;

error:
    goto end;
}